

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGNSPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
PerseusBGNSPlanner::BackupStageSampling
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusBGNSPlanner *this,BeliefSet *S,
          QFunctionsDiscrete *Q)

{
  undefined1 *this_00;
  double dVar1;
  pointer pvVar2;
  _func_int *p_Var3;
  JointBeliefInterface *pJVar4;
  bool bVar5;
  int k;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ostream *poVar10;
  int iVar11;
  ulong uVar12;
  PlanningUnitMADPDiscrete *this_01;
  uint uVar13;
  int b;
  size_type __n;
  double dVar14;
  reference rVar15;
  ulong local_298;
  vector<double,_std::allocator<double>_> VBalpha;
  ValueFunctionPOMDPDiscrete Qalphas;
  vector<double,_std::allocator<double>_> VB;
  ValueFunctionPOMDPDiscrete V;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  QB;
  AlphaVector alpha;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  AlphaVector local_180;
  GaoVectorSet Gao;
  _Bvector_base<std::allocator<bool>_> local_d8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b0;
  
  BeliefValue::GetValues(&VB,S,Q);
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  QB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  QB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  QB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    pvVar2 = (Q->
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(Q->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18 == (ulong)uVar13)
    break;
    BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&Gao,S,pvVar2 + uVar13);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&QB,(vector<double,_std::allocator<double>_> *)&Gao);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&Gao);
    uVar13 = uVar13 + 1;
  }
  p_Var3 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
  this_01 = *(PlanningUnitMADPDiscrete **)
             (p_Var3 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
  if (this_01 == (PlanningUnitMADPDiscrete *)0x0) {
    this_01 = *(PlanningUnitMADPDiscrete **)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var3)
    ;
  }
  local_298 = (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sVar6 = PlanningUnitMADPDiscrete::GetNrStates(this_01);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(Q->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&Gao);
  local_298 = local_298 >> 3;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&stillNeedToBeImproved,(long)(int)local_298,(bool *)&Gao,(allocator_type *)&alpha);
  AlphaVector::AlphaVector(&alpha,(long)(int)sVar6);
  AlphaVectorPlanning::QFunctionsToValueFunction(&V,Q);
  this_00 = &(this->super_AlphaVectorBG).field_0x18;
  Perseus::BackupStageLeadIn(&Gao,(Perseus *)this_00,&V);
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = local_298 & 0xffffffff;
  while ((int)local_298 != 0) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_d8,&stillNeedToBeImproved);
    k = Perseus::SampleNotImprovedBeliefIndex
                  ((Perseus *)this_00,(vector<bool,_std::allocator<bool>_> *)&local_d8,
                   (int)local_298);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_d8);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear(&Qalphas);
    uVar13 = 0;
    while( true ) {
      p_Var3 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
      lVar8 = *(long *)(p_Var3 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
      if (lVar8 == 0) {
        lVar8 = *(long *)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var3);
      }
      uVar9 = (**(code **)(**(long **)(lVar8 + 0x30) + 0x68))();
      uVar12 = (ulong)uVar13;
      if (uVar9 == uVar12) break;
      AlphaVectorBG::BeliefBackup
                (&local_180,&this->super_AlphaVectorBG,
                 (S->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[k],uVar13,&Gao,&V,
                 *(BGBackupType *)&(this->super_AlphaVectorBG).field_0xc8);
      AlphaVector::operator=(&alpha,&local_180);
      AlphaVector::~AlphaVector(&local_180);
      pJVar4 = (S->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[k];
      dVar14 = (double)(**(code **)(*(long *)((long)&pJVar4->field_0x0 +
                                             *(long *)((long)*pJVar4 + -0xb8)) + 0x80))
                                 ((long)&pJVar4->field_0x0 + *(long *)((long)*pJVar4 + -0xb8),
                                  &alpha._m_values);
      dVar1 = QB.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[k];
      if (dVar1 <= dVar14) {
        if (*(int *)&(this->super_AlphaVectorBG).field_0x28 != 0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Added vector for action ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,", belief ");
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,k);
          std::operator<<(poVar10," (Q ");
          poVar10 = std::ostream::_M_insert<double>(dVar14);
          std::operator<<(poVar10," >= ");
          poVar10 = std::ostream::_M_insert<double>(dVar1);
          poVar10 = std::operator<<(poVar10,")");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
      else {
        BeliefValue::GetMaximizingVector
                  (&local_180,S,k,
                   (Q->
                   super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar12);
        AlphaVector::operator=(&alpha,&local_180);
        AlphaVector::~AlphaVector(&local_180);
      }
      bVar5 = AlphaVectorPlanning::VectorIsInValueFunction
                        (&alpha,(__return_storage_ptr__->
                                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12);
      if (!bVar5) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar12,&alpha);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&Qalphas,&alpha);
      uVar13 = uVar13 + 1;
    }
    BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_180,S,&Qalphas);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&VBalpha,&local_180);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_180);
    iVar11 = 0;
    for (__n = 0; uVar7 != __n; __n = __n + 1) {
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n);
      if ((*rVar15._M_p & rVar15._M_mask) != 0) {
        if (VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[__n] <=
            VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[__n]) {
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n);
          iVar11 = iVar11 + 1;
          *rVar15._M_p = *rVar15._M_p & ~rVar15._M_mask;
          local_298 = (ulong)((int)local_298 - 1);
        }
      }
    }
    if (*(int *)&(this->super_AlphaVectorBG).field_0x28 != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Added vectors for ");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,k);
      std::operator<<(poVar10," (V ");
      poVar10 = std::ostream::_M_insert<double>
                          (VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[k]);
      poVar10 = std::operator<<(poVar10," improved ");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar11);
      poVar10 = std::operator<<(poVar10,")");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(&local_b0,&Gao);
  Perseus::BackupStageLeadOut((Perseus *)this_00,&local_b0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&local_b0);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&Qalphas);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&Gao);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&V);
  AlphaVector::~AlphaVector(&alpha);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&stillNeedToBeImproved.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&QB);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VBalpha.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VB.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
PerseusBGNSPlanner::BackupStageSampling(const BeliefSet &S,
                                        const QFunctionsDiscrete &Q) 
    const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;
    vector<vector<double> > QB;
    for(unsigned int a=0;a!=Q.size();++a)
        QB.push_back(BeliefValue::GetValues(S,Q[a]));

    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    double oldValue;
    QFunctionsDiscrete Q1(Q.size());
    vector<bool> stillNeedToBeImproved(nrB,true);
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    while(nrNotImproved!=0)
    {
        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // backup the belief
            alpha=AlphaVectorBG::BeliefBackup(*S[k],a,Gao,V,_m_backupType);

            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());

            // if not, get copy from old value function
            oldValue=QB[a][k];//VB[k]
            if(x<oldValue)
            {
#if DEBUG_PerseusBGNSPlanner
                cout << "Getting n-1 vector for action " << a << ", belief "
                     << k << " (" << x << " < " <<oldValue << ")" << endl;
#endif
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
            }
            else
            {
                if(GetVerbose())
                    cout << "Added vector for action " << a << ", belief " 
                         << k << " (Q " << x << " >= " << oldValue << ")"
                         << endl;
            }
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        // update which beliefs have been improved
        VBalpha=BeliefValue::GetValues(S,Qalphas);
        int nrImprovedByAlpha=0;
        for(int b=0;b!=nrB;b++)
            if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
            {
                stillNeedToBeImproved[b]=false;
                nrNotImproved--;
                nrImprovedByAlpha++;
            }

        if(GetVerbose())
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << " improved " << nrImprovedByAlpha << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}